

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O1

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  APlayerPawn *pAVar1;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  AActor *pAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *p;
  AWeapon *pAVar6;
  undefined4 extraout_var_01;
  PClassActor *type;
  AAmmo *pAVar7;
  PClass *pPVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PClass *pPVar9;
  PClass *pPVar10;
  AAmmo *ammo;
  bool bVar11;
  bool bVar12;
  FName local_28;
  FName local_24;
  
  local_24.Index = (int)((ulong)in_RAX >> 0x20);
  if (((item->renderflags).Value & 0x8000) != 0) {
    return;
  }
  pAVar5 = (this->prev).field_0.p;
  if ((pAVar5 != (AActor *)0x0) &&
     (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->prev).field_0.p = (AActor *)0x0;
    pAVar5 = (AActor *)0x0;
  }
  pPVar8 = AWeapon::RegistrationInfo.MyClass;
  if (pAVar5 == item) {
    return;
  }
  if ((alwaysapplydmflags.Value == false) && (deathmatch.Value == 0)) {
    bVar12 = false;
  }
  else {
    bVar12 = ((byte)dmflags.Value & 4) == 0;
  }
  if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar2 = AAmmo::RegistrationInfo.MyClass;
  pPVar9 = (item->super_DThinker).super_DObject.Class;
  bVar11 = pPVar9 != (PClass *)0x0;
  pPVar10 = pPVar9;
  if (pPVar9 != pPVar8 && bVar11) {
    do {
      pPVar10 = pPVar10->ParentClass;
      bVar11 = pPVar10 != (PClass *)0x0;
      if (pPVar10 == pPVar8) break;
    } while (pPVar10 != (PClass *)0x0);
  }
  if (bVar11) {
    pAVar1 = this->player->mo;
    if (pPVar9 == (PClass *)0x0) {
      iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar3);
    }
    p = AActor::FindInventory
                  (&pAVar1->super_AActor,(PClassActor *)(item->super_DThinker).super_DObject.Class,
                   false);
    pAVar6 = dyn_cast<AWeapon>((DObject *)p);
    if (pAVar6 == (AWeapon *)0x0) goto LAB_0034db25;
    if (!bVar12) {
      return;
    }
    pAVar7 = (pAVar6->Ammo1).field_0.p;
    if (pAVar7 != (AAmmo *)0x0) {
      if (((pAVar7->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          == 0) {
        pAVar7 = (pAVar6->Ammo1).field_0.p;
        if ((pAVar7->super_AInventory).Amount < (pAVar7->super_AInventory).MaxAmount)
        goto LAB_0034db25;
      }
      else {
        (pAVar6->Ammo1).field_0.p = (AAmmo *)0x0;
      }
    }
    pAVar7 = (pAVar6->Ammo2).field_0.p;
    if (pAVar7 == (AAmmo *)0x0) {
      return;
    }
    if (((pAVar7->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) !=
        0) {
      (pAVar6->Ammo2).field_0.p = (AAmmo *)0x0;
      return;
    }
    pAVar7 = (pAVar6->Ammo2).field_0.p;
  }
  else {
    if (pPVar9 == (PClass *)0x0) {
      iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar3);
    }
    pPVar8 = (item->super_DThinker).super_DObject.Class;
    bVar12 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar2 && bVar12) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar2) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar12) {
      iVar3 = FName::NameManager::FindName(&FName::NameData,"Megasphere",true);
      _local_28 = CONCAT44(local_24.Index,iVar3);
      pPVar8 = PClass::FindClass(&local_28);
      if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
        (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar3);
      }
      pPVar9 = (item->super_DThinker).super_DObject.Class;
      bVar12 = pPVar9 != (PClass *)0x0;
      if (pPVar9 != pPVar8 && bVar12) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar12 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar8) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if (bVar12) {
LAB_0034da60:
        if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
          return;
        }
      }
      else {
        iVar3 = FName::NameManager::FindName(&FName::NameData,"Soulsphere",true);
        _local_28 = CONCAT44(iVar3,local_28.Index);
        pPVar8 = PClass::FindClass(&local_24);
        if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
          (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_03,iVar3);
        }
        pPVar9 = (item->super_DThinker).super_DObject.Class;
        bVar12 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar8 && bVar12) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar12 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar8) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (bVar12) goto LAB_0034da60;
        pPVar8 = PClass::FindClass("HealthBonus");
        bVar12 = DObject::IsKindOf((DObject *)item,pPVar8);
        if (bVar12) goto LAB_0034da60;
      }
      pPVar8 = AHealth::RegistrationInfo.MyClass;
      if ((item->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
        (item->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_04,iVar3);
      }
      pPVar9 = (item->super_DThinker).super_DObject.Class;
      bVar12 = pPVar9 != (PClass *)0x0;
      if (pPVar9 != pPVar8 && bVar12) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar12 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar8) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if ((bVar12) &&
         (pAVar1 = this->player->mo, iVar3 = (pAVar1->super_AActor).health,
         iVar4 = APlayerPawn::GetMaxHealth(pAVar1),
         iVar4 + (this->player->mo->super_AActor).stamina <= iVar3)) {
        return;
      }
      goto LAB_0034db25;
    }
    type = AAmmo::GetParentAmmo((AAmmo *)item);
    pAVar7 = (AAmmo *)AActor::FindInventory(&this->player->mo->super_AActor,type,false);
    if (pAVar7 == (AAmmo *)0x0) goto LAB_0034db25;
  }
  if ((pAVar7->super_AInventory).MaxAmount <= (pAVar7->super_AInventory).Amount) {
    return;
  }
LAB_0034db25:
  pAVar5 = (this->dest).field_0.p;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((((this->dest).field_0.p)->flags).Value & 1) != 0) {
        return;
      }
    }
    else {
      (this->dest).field_0.p = (AActor *)0x0;
    }
  }
  (this->prev).field_0 = (this->dest).field_0;
  (this->dest).field_0.p = item;
  this->t_roam = 0x8c;
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= player->mo->GetMaxHealth() + player->mo->stamina)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}